

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O1

pint p_test_case_sha3_512_test(void)

{
  p_test_module_fail_counter = 0;
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA3_512,0x40,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",&DAT_001042b0,
                    &DAT_001042f0,&DAT_00104330,
                    "b751850b1a57168a5693cd924b6b096e08f621827444f70d884f5d0240d2712e10e116e9192af3c91a7ec57647e3934057340b4cf408d5a56592f8274eec53f0"
                    ,
                    "04a371e84ecfb5b8b77cb48610fca8182dd457ce6f326a0fd3d7ec2f1e91636dee691fbe0c985302ba1b0d8dc78c086346b533b49c030d99a27daf1139d6e75e"
                    ,
                    "3c3a876da14034ab60627c077bb98f7e120a2a5370212dffb3385a18d4f38859ed311d0a9d5141ce9cc5c66ee689b266a8aa18ace8282a0e0db596c90b0a7b87"
                    ,
                    "16f59fe0b4344af86b37eb145afe41e9dadb45279d074c5bf5c649dd3d2952e47c0ac3a59ea19dc8395d04e8a72fddd9307b839c35fc4bc44a0463003b80dcf1"
                   );
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (sha3_512_test)
{
	const puchar	hash_etalon_1[] = {183,  81, 133,  11,  26,  87,  22, 138,
					    86, 147, 205, 146,  75, 107,   9, 110,
					     8, 246,  33, 130, 116,  68, 247,  13,
					   136,  79,  93,   2,  64, 210, 113,  46,
					    16, 225,  22, 233,  25,  42, 243, 201,
					    26, 126, 197, 118,  71, 227, 147,  64,
					    87,  52,  11,  76, 244,   8, 213, 165,
					   101, 146, 248,  39,  78, 236,  83, 240};
	const puchar	hash_etalon_2[] = {  4, 163, 113, 232,  78, 207, 181, 184,
					   183, 124, 180, 134,  16, 252, 168,  24,
					    45, 212,  87, 206, 111,  50, 106,  15,
					   211, 215, 236,  47,  30, 145,  99, 109,
					   238, 105,  31, 190,  12, 152,  83,   2,
					   186,  27,  13, 141, 199, 140,   8,  99,
					    70, 181,  51, 180, 156,   3,  13, 153,
					   162, 125, 175,  17,  57, 214, 231,  94};
	const puchar	hash_etalon_3[] = { 60,  58, 135, 109, 161,  64,  52, 171,
					    96,  98, 124,   7, 123, 185, 143, 126,
					    18,  10,  42,  83, 112,  33,  45, 255,
					   179,  56,  90,  24, 212, 243, 136,  89,
					   237,  49,  29,  10, 157,  81,  65, 206,
					   156, 197, 198, 110, 230, 137, 178, 102,
					   168, 170,  24, 172, 232,  40,  42,  14,
					    13, 181, 150, 201,  11,  10, 123, 135};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA3_512,
			   64,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "b751850b1a57168a5693cd924b6b096e08f621827444f70d884f5d0240d2712e10e116e9192af3c91a7ec57647e3934057340b4cf408d5a56592f8274eec53f0",
			   "04a371e84ecfb5b8b77cb48610fca8182dd457ce6f326a0fd3d7ec2f1e91636dee691fbe0c985302ba1b0d8dc78c086346b533b49c030d99a27daf1139d6e75e",
			   "3c3a876da14034ab60627c077bb98f7e120a2a5370212dffb3385a18d4f38859ed311d0a9d5141ce9cc5c66ee689b266a8aa18ace8282a0e0db596c90b0a7b87",
			   "16f59fe0b4344af86b37eb145afe41e9dadb45279d074c5bf5c649dd3d2952e47c0ac3a59ea19dc8395d04e8a72fddd9307b839c35fc4bc44a0463003b80dcf1");

	p_libsys_shutdown ();
}